

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O1

void __thiscall
llvm::Triple::getEnvironmentVersion(Triple *this,uint *Major,uint *Minor,uint *Micro)

{
  int iVar1;
  ulong __n;
  StringRef Name;
  StringRef SVar3;
  char *__s1;
  ulong uVar2;
  
  Name = getEnvironmentName(this);
  uVar2 = Name.Length;
  __s1 = Name.Data;
  SVar3 = getEnvironmentTypeName(this->Environment);
  __n = SVar3.Length;
  if (__n <= uVar2) {
    if (__n != 0) {
      iVar1 = bcmp(__s1,SVar3.Data,__n);
      if (iVar1 != 0) goto LAB_00160c2e;
    }
    if (uVar2 < __n) {
      __n = uVar2;
    }
    Name.Length = uVar2 - __n;
    Name.Data = __s1 + __n;
  }
LAB_00160c2e:
  parseVersionFromName(Name,Major,Minor,Micro);
  return;
}

Assistant:

void Triple::getEnvironmentVersion(unsigned &Major, unsigned &Minor,
                                   unsigned &Micro) const {
  StringRef EnvironmentName = getEnvironmentName();
  StringRef EnvironmentTypeName = getEnvironmentTypeName(getEnvironment());
  if (EnvironmentName.startswith(EnvironmentTypeName))
    EnvironmentName = EnvironmentName.substr(EnvironmentTypeName.size());

  parseVersionFromName(EnvironmentName, Major, Minor, Micro);
}